

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O1

uint8 * rw::d3d::rasterLock(Raster *raster,int32 level,int32 lockMode)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint8 *puVar4;
  long lVar5;
  
  if ((raster->privateFlags & 6U) != 0) {
    return (uint8 *)0x0;
  }
  lVar5 = (long)nativeRasterOffset;
  lVar2 = *(long *)((long)&raster->platform + lVar5);
  lVar3 = (long)level;
  puVar4 = *(uint8 **)(lVar2 + 0x18 + lVar3 * 0x18);
  raster->pixels = puVar4;
  iVar1 = *(int *)(lVar2 + 8 + lVar3 * 0x18);
  raster->width = iVar1;
  raster->height = *(int32 *)(lVar2 + 0xc + lVar3 * 0x18);
  raster->stride = iVar1 * *(int *)((long)&raster->depth + lVar5);
  if ((lockMode & 2U) != 0) {
    raster->privateFlags = raster->privateFlags | 2;
  }
  if ((lockMode & 1U) == 0) {
    return puVar4;
  }
  *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 4;
  return puVar4;
}

Assistant:

uint8*
rasterLock(Raster *raster, int32 level, int32 lockMode)
{
	D3dRaster *natras = GETD3DRASTEREXT(raster);

	// check if already locked
	if(raster->privateFlags & (Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE))
		return nil;

#ifdef RW_D3D9
	DWORD flags = D3DLOCK_NOSYSLOCK;
	if(lockMode & Raster::LOCKREAD)
		flags |= D3DLOCK_READONLY | D3DLOCK_NO_DIRTY_UPDATE;
	IDirect3DTexture9 *tex = (IDirect3DTexture9*)natras->texture;
	IDirect3DSurface9 *surf, *rt;
	D3DLOCKED_RECT lr;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE: {
		tex->GetSurfaceLevel(level, &surf);
		natras->lockedSurf = surf;
		HRESULT res = surf->LockRect(&lr, 0, flags);
		assert(res == D3D_OK);
		break;
		}

	case Raster::CAMERATEXTURE:
	case Raster::CAMERA: {
		if(lockMode & Raster::PRIVATELOCK_WRITE)
			assert(0 && "can't lock framebuffer for writing");
		if(raster->type == Raster::CAMERA)
			rt = d3d9Globals.defaultRenderTarget;
		else
			tex->GetSurfaceLevel(level, &rt);
		D3DSURFACE_DESC desc;
		rt->GetDesc(&desc);
		HRESULT res = d3ddevice->CreateOffscreenPlainSurface(desc.Width, desc.Height, desc.Format, D3DPOOL_SYSTEMMEM, &surf, nil);
		if(res != D3D_OK)
			return nil;
		d3ddevice->GetRenderTargetData(rt, surf);
		natras->lockedSurf = surf;
		res = surf->LockRect(&lr, 0, flags);
		assert(res == D3D_OK);
		break;
		}

	default:
		assert(0 && "can't lock this raster type (yet)");
	}

	raster->pixels = (uint8*)lr.pBits;
	raster->width >>= level;
	raster->height >>= level;
	raster->stride = lr.Pitch;
	if(raster->width == 0) raster->width = 1;
	if(raster->height == 0) raster->height = 1;
#else
	RasterLevels *levels = (RasterLevels*)natras->texture;
	raster->pixels = levels->levels[level].data;
	raster->width = levels->levels[level].width;
	raster->height = levels->levels[level].height;
	raster->stride = raster->width*natras->bpp;
#endif
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE;

	return raster->pixels;
}